

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint inflateHuffmanBlock(ucvector *out,uchar *in,size_t *bp,size_t *pos,size_t inlength,uint btype)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ulong inbitlength_00;
  size_t length;
  size_t backward;
  size_t forward;
  size_t start;
  uint numextrabits_d;
  uint numextrabits_l;
  uint distance;
  uint code_d;
  uint code_ll;
  size_t inbitlength;
  HuffmanTree tree_d;
  HuffmanTree tree_ll;
  uint error;
  uint btype_local;
  size_t inlength_local;
  size_t *pos_local;
  size_t *bp_local;
  uchar *in_local;
  ucvector *out_local;
  
  tree_ll.maxbitlen = 0;
  inbitlength_00 = inlength << 3;
  HuffmanTree_init((HuffmanTree *)&tree_d.maxbitlen);
  HuffmanTree_init((HuffmanTree *)&inbitlength);
  if (btype == 1) {
    getTreeInflateFixed((HuffmanTree *)&tree_d.maxbitlen,(HuffmanTree *)&inbitlength);
  }
  else if (btype == 2) {
    tree_ll.maxbitlen =
         getTreeInflateDynamic
                   ((HuffmanTree *)&tree_d.maxbitlen,(HuffmanTree *)&inbitlength,in,bp,inlength);
  }
LAB_00113663:
  do {
    if (tree_ll.maxbitlen != 0) {
LAB_0011396e:
      HuffmanTree_cleanup((HuffmanTree *)&tree_d.maxbitlen);
      HuffmanTree_cleanup((HuffmanTree *)&inbitlength);
      return tree_ll.maxbitlen;
    }
    uVar2 = huffmanDecodeSymbol(in,bp,(HuffmanTree *)&tree_d.maxbitlen,inbitlength_00);
    if (0xff < uVar2) {
      if ((uVar2 < 0x101) || (0x11d < uVar2)) {
        if ((uVar2 != 0x100) && (tree_ll.maxbitlen = 0xb, inlength << 3 < *bp)) {
          tree_ll.maxbitlen = 10;
        }
        goto LAB_0011396e;
      }
      uVar3 = LENGTHBASE[uVar2 - 0x101];
      if (inbitlength_00 <= *bp) {
        tree_ll.maxbitlen = 0x33;
        goto LAB_0011396e;
      }
      uVar4 = readBitsFromStream(bp,in,(ulong)LENGTHEXTRA[uVar2 - 0x101]);
      uVar5 = huffmanDecodeSymbol(in,bp,(HuffmanTree *)&inbitlength,inbitlength_00);
      if (0x1d < uVar5) {
        if (uVar2 == 0xffffffff) {
          tree_ll.maxbitlen = 0xb;
          if (inlength << 3 < *bp) {
            tree_ll.maxbitlen = 10;
          }
        }
        else {
          tree_ll.maxbitlen = 0x12;
        }
        goto LAB_0011396e;
      }
      uVar2 = DISTANCEBASE[uVar5];
      if (inbitlength_00 <= *bp) {
        tree_ll.maxbitlen = 0x33;
        goto LAB_0011396e;
      }
      uVar5 = readBitsFromStream(bp,in,(ulong)DISTANCEEXTRA[uVar5]);
      uVar5 = uVar5 + uVar2;
      uVar1 = *pos;
      if (uVar1 < uVar5) {
        tree_ll.maxbitlen = 0x34;
        goto LAB_0011396e;
      }
      length = uVar1 - uVar5;
      uVar2 = ucvector_resize(out,*pos + (ulong)uVar4 + (ulong)uVar3);
      if (uVar2 == 0) {
        tree_ll.maxbitlen = 0x53;
        goto LAB_0011396e;
      }
      for (backward = 0; backward < (ulong)uVar4 + (ulong)uVar3; backward = backward + 1) {
        out->data[*pos] = out->data[length];
        *pos = *pos + 1;
        length = length + 1;
        if (uVar1 <= length) {
          length = uVar1 - uVar5;
        }
      }
      goto LAB_00113663;
    }
    uVar3 = ucvector_resize(out,*pos + 1);
    if (uVar3 == 0) {
      tree_ll.maxbitlen = 0x53;
      goto LAB_0011396e;
    }
    out->data[*pos] = (uchar)uVar2;
    *pos = *pos + 1;
  } while( true );
}

Assistant:

static unsigned inflateHuffmanBlock(ucvector* out, const unsigned char* in, size_t* bp,
                                    size_t* pos, size_t inlength, unsigned btype)
{
  unsigned error = 0;
  HuffmanTree tree_ll; /*the huffman tree for literal and length codes*/
  HuffmanTree tree_d; /*the huffman tree for distance codes*/
  size_t inbitlength = inlength * 8;

  HuffmanTree_init(&tree_ll);
  HuffmanTree_init(&tree_d);

  if(btype == 1) getTreeInflateFixed(&tree_ll, &tree_d);
  else if(btype == 2) error = getTreeInflateDynamic(&tree_ll, &tree_d, in, bp, inlength);

  while(!error) /*decode all symbols until end reached, breaks at end code*/
  {
    /*code_ll is literal, length or end code*/
    unsigned code_ll = huffmanDecodeSymbol(in, bp, &tree_ll, inbitlength);
    if(code_ll <= 255) /*literal symbol*/
    {
      /*ucvector_push_back would do the same, but for some reason the two lines below run 10% faster*/
      if(!ucvector_resize(out, (*pos) + 1)) ERROR_BREAK(83 /*alloc fail*/);
      out->data[*pos] = (unsigned char)code_ll;
      (*pos)++;
    }
    else if(code_ll >= FIRST_LENGTH_CODE_INDEX && code_ll <= LAST_LENGTH_CODE_INDEX) /*length code*/
    {
      unsigned code_d, distance;
      unsigned numextrabits_l, numextrabits_d; /*extra bits for length and distance*/
      size_t start, forward, backward, length;

      /*part 1: get length base*/
      length = LENGTHBASE[code_ll - FIRST_LENGTH_CODE_INDEX];

      /*part 2: get extra bits and add the value of that to length*/
      numextrabits_l = LENGTHEXTRA[code_ll - FIRST_LENGTH_CODE_INDEX];
      if(*bp >= inbitlength) ERROR_BREAK(51); /*error, bit pointer will jump past memory*/
      length += readBitsFromStream(bp, in, numextrabits_l);

      /*part 3: get distance code*/
      code_d = huffmanDecodeSymbol(in, bp, &tree_d, inbitlength);
      if(code_d > 29)
      {
        if(code_ll == (unsigned)(-1)) /*huffmanDecodeSymbol returns (unsigned)(-1) in case of error*/
        {
          /*return error code 10 or 11 depending on the situation that happened in huffmanDecodeSymbol
          (10=no endcode, 11=wrong jump outside of tree)*/
          error = (*bp) > inlength * 8 ? 10 : 11;
        }
        else error = 18; /*error: invalid distance code (30-31 are never used)*/
        break;
      }
      distance = DISTANCEBASE[code_d];

      /*part 4: get extra bits from distance*/
      numextrabits_d = DISTANCEEXTRA[code_d];
      if(*bp >= inbitlength) ERROR_BREAK(51); /*error, bit pointer will jump past memory*/

      distance += readBitsFromStream(bp, in, numextrabits_d);

      /*part 5: fill in all the out[n] values based on the length and dist*/
      start = (*pos);
      if(distance > start) ERROR_BREAK(52); /*too long backward distance*/
      backward = start - distance;

      if(!ucvector_resize(out, (*pos) + length)) ERROR_BREAK(83 /*alloc fail*/);
      for(forward = 0; forward < length; forward++)
      {
        out->data[(*pos)] = out->data[backward];
        (*pos)++;
        backward++;
        if(backward >= start) backward = start - distance;
      }
    }
    else if(code_ll == 256)
    {
      break; /*end code, break the loop*/
    }
    else /*if(code == (unsigned)(-1))*/ /*huffmanDecodeSymbol returns (unsigned)(-1) in case of error*/
    {
      /*return error code 10 or 11 depending on the situation that happened in huffmanDecodeSymbol
      (10=no endcode, 11=wrong jump outside of tree)*/
      error = (*bp) > inlength * 8 ? 10 : 11;
      break;
    }
  }

  HuffmanTree_cleanup(&tree_ll);
  HuffmanTree_cleanup(&tree_d);

  return error;
}